

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadCodeSection(BinaryReader *this,Offset section_size)

{
  Type type;
  uint uVar1;
  bool bVar2;
  int iVar3;
  Result RVar4;
  char *pcVar5;
  uint uVar6;
  Offset OVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  Index *count;
  bool bVar11;
  bool bVar12;
  Type local_type;
  Index num_local_decls;
  uint32_t body_size;
  Enum local_60;
  Type local_58;
  uint local_50;
  uint local_4c;
  Offset local_48;
  Index *local_40;
  ulong local_38;
  
  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x32])();
  if (iVar3 == 0) {
    count = &this->num_function_bodies_;
    RVar4 = ReadCount(this,count,"function body count");
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    if (this->num_function_signatures_ == this->num_function_bodies_) {
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x33])();
      if (iVar3 == 0) {
        bVar11 = *count != 0;
        if (bVar11) {
          uVar10 = 0;
          do {
            uVar9 = this->num_func_imports_ + uVar10;
            RVar4 = ReadU32Leb128(this,&local_4c,"function body size");
            if (RVar4.enum_ == Error) {
LAB_00126aca:
              bVar12 = false;
            }
            else {
              OVar7 = (this->state_).offset + (ulong)local_4c;
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x34])
                                (this->delegate_,(ulong)uVar9);
              if (iVar3 == 0) {
                RVar4 = ReadCount(this,&local_50,"local declaration count");
                uVar1 = local_50;
                if (RVar4.enum_ == Error) goto LAB_00126aca;
                iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x35])();
                if (iVar3 != 0) {
                  pcVar5 = "OnLocalDeclCount callback failed";
                  goto LAB_00126afb;
                }
                bVar12 = uVar1 != 0;
                local_48 = OVar7;
                local_40 = count;
                if (bVar12) {
                  local_38 = 0;
                  uVar8 = 0;
                  do {
                    RVar4 = ReadU32Leb128(this,(uint32_t *)&local_58,"local type count");
                    bVar2 = false;
                    if (RVar4.enum_ != Error) {
                      local_60 = local_58.enum_;
                    }
                    if (RVar4.enum_ != Error) {
                      local_38 = local_38 + (uint)local_60;
                      if (local_38 < 0xffffffff) {
                        RVar4 = ReadType(this,&local_58,"local type");
                        if (RVar4.enum_ == Error) {
                          bVar2 = false;
                          goto LAB_00126c43;
                        }
                        type.type_index_ = local_58.type_index_;
                        type.enum_ = local_58.enum_;
                        bVar2 = IsConcreteType(this,type);
                        pcVar5 = "expected valid local type";
                        if (bVar2) {
                          iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x36])
                                            (this->delegate_,uVar8,(ulong)(uint)local_60,type);
                          pcVar5 = "OnLocalDecl callback failed";
                          if (iVar3 == 0) {
                            bVar2 = true;
                            goto LAB_00126c43;
                          }
                        }
                      }
                      else {
                        pcVar5 = "local count must be < 0x10000000";
                      }
                      bVar2 = false;
                      PrintError(this,pcVar5);
                    }
LAB_00126c43:
                    if (!bVar2) break;
                    uVar6 = (int)uVar8 + 1;
                    uVar8 = (ulong)uVar6;
                    bVar12 = uVar6 < uVar1;
                  } while (uVar6 != uVar1);
                }
                count = local_40;
                if (bVar12) {
                  bVar12 = false;
                }
                else {
                  if (this->options_->skip_function_bodies == true) {
                    (this->state_).offset = local_48;
                  }
                  else {
                    RVar4 = ReadFunctionBody(this,local_48);
                    if (RVar4.enum_ == Error) goto LAB_00126aca;
                  }
                  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x86])
                                    (this->delegate_,(ulong)uVar9);
                  if (iVar3 != 0) {
                    pcVar5 = "EndFunctionBody callback failed";
                    goto LAB_00126afb;
                  }
                  bVar12 = true;
                }
              }
              else {
                pcVar5 = "BeginFunctionBody callback failed";
LAB_00126afb:
                bVar12 = false;
                PrintError(this,pcVar5);
              }
            }
            if (!bVar12) break;
            uVar10 = uVar10 + 1;
            bVar11 = uVar10 < *count;
          } while (bVar11);
        }
        if (bVar11) {
          return (Result)Error;
        }
        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x87])();
        if (iVar3 == 0) {
          return (Result)Ok;
        }
        pcVar5 = "EndCodeSection callback failed";
      }
      else {
        pcVar5 = "OnFunctionBodyCount callback failed";
      }
    }
    else {
      pcVar5 = "function signature count != function body count";
    }
  }
  else {
    pcVar5 = "BeginCodeSection callback failed";
  }
  PrintError(this,pcVar5);
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadCodeSection(Offset section_size) {
  CALLBACK(BeginCodeSection, section_size);
  CHECK_RESULT(ReadCount(&num_function_bodies_, "function body count"));
  ERROR_UNLESS(num_function_signatures_ == num_function_bodies_,
               "function signature count != function body count");
  CALLBACK(OnFunctionBodyCount, num_function_bodies_);
  for (Index i = 0; i < num_function_bodies_; ++i) {
    Index func_index = num_func_imports_ + i;
    Offset func_offset = state_.offset;
    state_.offset = func_offset;
    uint32_t body_size;
    CHECK_RESULT(ReadU32Leb128(&body_size, "function body size"));
    Offset body_start_offset = state_.offset;
    Offset end_offset = body_start_offset + body_size;
    CALLBACK(BeginFunctionBody, func_index, body_size);

    uint64_t total_locals = 0;
    Index num_local_decls;
    CHECK_RESULT(ReadCount(&num_local_decls, "local declaration count"));
    CALLBACK(OnLocalDeclCount, num_local_decls);
    for (Index k = 0; k < num_local_decls; ++k) {
      Index num_local_types;
      CHECK_RESULT(ReadIndex(&num_local_types, "local type count"));
      total_locals += num_local_types;
      ERROR_UNLESS(total_locals < UINT32_MAX,
                   "local count must be < 0x10000000");
      Type local_type;
      CHECK_RESULT(ReadType(&local_type, "local type"));
      ERROR_UNLESS(IsConcreteType(local_type), "expected valid local type");
      CALLBACK(OnLocalDecl, k, num_local_types, local_type);
    }

    if (options_.skip_function_bodies) {
      state_.offset = end_offset;
    } else {
      CHECK_RESULT(ReadFunctionBody(end_offset));
    }

    CALLBACK(EndFunctionBody, func_index);
  }
  CALLBACK0(EndCodeSection);
  return Result::Ok;
}